

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eps,
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *rhs,int *rhsidx,int rhsn)

{
  uint *puVar1;
  int iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  fpclass_type fVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  int *piVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_1f8;
  ulong local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  int *local_f0;
  int *local_e8;
  pointer local_e0;
  int *local_d8;
  int *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  int *local_c0;
  int *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  long lVar17;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  if (0 < rhsn) {
    local_d0 = (this->row).orig;
    local_b8 = (this->col).orig;
    local_c0 = (this->col).perm;
    uVar11 = 0;
    do {
      iVar7 = local_c0[rhsidx[uVar11]];
      if (uVar11 == 0) {
        lVar17 = 0;
      }
      else {
        uVar20 = uVar11 & 0xffffffff;
        do {
          uVar21 = (uint)uVar20 - 1;
          uVar14 = uVar21 >> 1;
          uVar15 = (uint)uVar20;
          if (rhsidx[uVar14] <= iVar7) break;
          rhsidx[uVar20] = rhsidx[uVar14];
          uVar20 = (ulong)uVar14;
          uVar15 = uVar14;
        } while (1 < uVar21);
        lVar17 = (long)(int)uVar15;
      }
      uVar11 = uVar11 + 1;
      rhsidx[lVar17] = iVar7;
    } while (uVar11 != (uint)rhsn);
    if (0 < rhsn) {
      local_e0 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_e8 = (this->u).row.idx;
      local_d8 = (this->u).row.len;
      local_f0 = (this->u).row.start;
      local_140 = this;
      local_100 = eps;
      local_f8 = rhs;
      local_c8 = vec;
      do {
        iVar7 = *rhsidx;
        local_1c0 = (ulong)(rhsn - 1U);
        iVar5 = rhsidx[local_1c0];
        iVar10 = 1;
        iVar6 = 0;
        if (3 < (uint)rhsn) {
          iVar6 = 0;
          do {
            iVar2 = rhsidx[iVar10];
            iVar19 = rhsidx[(long)iVar10 + 1];
            if (iVar2 < iVar19) {
              iVar9 = iVar10;
              iVar19 = iVar2;
              if (iVar5 <= iVar2) goto LAB_002916a2;
            }
            else {
              if (iVar5 <= iVar19) goto LAB_002916a2;
              iVar9 = iVar10 + 1;
            }
            rhsidx[iVar6] = iVar19;
            iVar10 = iVar9 * 2 + 1;
            iVar6 = iVar9;
          } while (iVar10 < (int)(rhsn - 2U));
        }
        if ((iVar10 < (int)(rhsn - 1U)) && (rhsidx[iVar10] < iVar5)) {
          rhsidx[iVar6] = rhsidx[iVar10];
          iVar6 = iVar10;
        }
LAB_002916a2:
        rhsidx[iVar6] = iVar5;
        iVar5 = local_b8[iVar7];
        local_1b8.data._M_elems._32_8_ =
             *(undefined8 *)(local_f8[iVar5].m_backend.data._M_elems + 8);
        local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_f8[iVar5].m_backend.data._M_elems;
        local_1b8.data._M_elems._8_8_ = *(undefined8 *)(local_f8[iVar5].m_backend.data._M_elems + 2)
        ;
        puVar1 = local_f8[iVar5].m_backend.data._M_elems + 4;
        local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_1b8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_1b8.exp = local_f8[iVar5].m_backend.exp;
        local_1b8.neg = local_f8[iVar5].m_backend.neg;
        local_1b8.fpclass = local_f8[iVar5].m_backend.fpclass;
        local_1b8.prec_elem = local_f8[iVar5].m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&local_f8[iVar5].m_backend,0);
        local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
        local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
        local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
        local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
        local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
        local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
        local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
        local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
        uVar4 = local_1f8.data._M_elems._0_8_;
        local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
        local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
        local_68.data._M_elems._0_8_ = *(undefined8 *)(local_100->m_backend).data._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((local_100->m_backend).data._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((local_100->m_backend).data._M_elems + 4);
        local_68.data._M_elems._24_8_ = *(undefined8 *)((local_100->m_backend).data._M_elems + 6);
        local_68.data._M_elems._32_8_ = *(undefined8 *)((local_100->m_backend).data._M_elems + 8);
        local_68.exp = (local_100->m_backend).exp;
        local_68.neg = (local_100->m_backend).neg;
        local_68.fpclass = (local_100->m_backend).fpclass;
        local_68.prec_elem = (local_100->m_backend).prec_elem;
        local_1f8.exp = local_1b8.exp;
        local_1f8.neg = local_1b8.neg;
        local_1f8.fpclass = local_1b8.fpclass;
        local_1f8.prec_elem = local_1b8.prec_elem;
        if ((local_1b8.neg == true) &&
           (local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0],
           local_1f8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite)) {
          local_1f8.neg = false;
        }
        local_1f8.data._M_elems._0_8_ = uVar4;
        if ((local_68.fpclass != cpp_dec_float_NaN && local_1b8.fpclass != cpp_dec_float_NaN) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1f8,&local_68), 0 < iVar5)) {
          iVar7 = local_d0[iVar7];
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_1b8,
                     &(local_140->diag).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
          *(undefined8 *)local_c8[iVar7].m_backend.data._M_elems = local_1b8.data._M_elems._0_8_;
          *(undefined8 *)(local_c8[iVar7].m_backend.data._M_elems + 2) =
               local_1b8.data._M_elems._8_8_;
          puVar1 = local_c8[iVar7].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
          *(undefined8 *)(local_c8[iVar7].m_backend.data._M_elems + 8) =
               local_1b8.data._M_elems._32_8_;
          local_c8[iVar7].m_backend.exp = local_1b8.exp;
          local_c8[iVar7].m_backend.neg = local_1b8.neg;
          local_c8[iVar7].m_backend.fpclass = local_1b8.fpclass;
          local_c8[iVar7].m_backend.prec_elem = local_1b8.prec_elem;
          iVar5 = local_d8[iVar7];
          if (iVar5 != 0) {
            pcVar23 = &local_e0[local_f0[iVar7]].m_backend;
            piVar22 = local_e8 + local_f0[iVar7];
            do {
              iVar7 = *piVar22;
              pnVar13 = local_f8 + iVar7;
              local_178.data._M_elems._32_8_ =
                   *(undefined8 *)(local_f8[iVar7].m_backend.data._M_elems + 8);
              local_178.data._M_elems._0_8_ = *(undefined8 *)local_f8[iVar7].m_backend.data._M_elems
              ;
              local_178.data._M_elems._8_8_ =
                   *(undefined8 *)(local_f8[iVar7].m_backend.data._M_elems + 2);
              puVar1 = local_f8[iVar7].m_backend.data._M_elems + 4;
              local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_178.exp = local_f8[iVar7].m_backend.exp;
              local_178.neg = local_f8[iVar7].m_backend.neg;
              local_178.fpclass = local_f8[iVar7].m_backend.fpclass;
              local_178.prec_elem = local_f8[iVar7].m_backend.prec_elem;
              if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_0029193c:
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems._24_5_ = 0;
                local_1f8.data._M_elems[7]._1_3_ = 0;
                local_1f8.data._M_elems._32_5_ = 0;
                local_1f8.data._M_elems[9]._1_3_ = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                pcVar18 = &local_1b8;
                if (&local_1f8 != pcVar23) {
                  local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
                  local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
                  local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
                  local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
                  local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
                  local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
                  local_1f8.exp = local_1b8.exp;
                  local_1f8.neg = local_1b8.neg;
                  local_1f8.fpclass = local_1b8.fpclass;
                  local_1f8.prec_elem = local_1b8.prec_elem;
                  pcVar18 = pcVar23;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_1f8,pcVar18);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_178,&local_1f8);
                fVar8 = cpp_dec_float_NaN;
                if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_002919fb:
                  local_138.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
                  local_138.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
                  local_138.data._M_elems[4] = local_178.data._M_elems[4];
                  local_138.data._M_elems[5] = local_178.data._M_elems[5];
                  local_138.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
                  local_138.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
                  local_138.data._M_elems[0] = local_178.data._M_elems[0];
                  local_138.data._M_elems[1] = local_178.data._M_elems[1];
                  local_138.data._M_elems[2] = local_178.data._M_elems[2];
                  local_138.data._M_elems[3] = local_178.data._M_elems[3];
                  pcVar18 = &local_178;
                  iVar7 = local_178.exp;
                  bVar12 = local_178.neg;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
                  iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_178,&local_1f8);
                  if (iVar7 != 0) {
                    fVar8 = local_178.fpclass;
                    goto LAB_002919fb;
                  }
                  local_138.fpclass = cpp_dec_float_finite;
                  local_138.prec_elem = 10;
                  local_138.data._M_elems[0] = 0;
                  local_138.data._M_elems[1] = 0;
                  local_138.data._M_elems[2] = 0;
                  local_138.data._M_elems[3] = 0;
                  local_138.data._M_elems[4] = 0;
                  local_138.data._M_elems[5] = 0;
                  local_138.data._M_elems._24_5_ = 0;
                  local_138.data._M_elems[7]._1_3_ = 0;
                  local_138.data._M_elems._32_5_ = 0;
                  local_138.data._M_elems[9]._1_3_ = 0;
                  local_138.exp = 0;
                  local_138.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&local_138,1e-100);
                  pcVar18 = &local_138;
                  fVar8 = local_138.fpclass;
                  iVar7 = local_138.exp;
                  bVar12 = local_138.neg;
                }
                iVar3 = pcVar18->prec_elem;
                *(ulong *)((pnVar13->m_backend).data._M_elems + 8) =
                     CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
                *(undefined8 *)((pnVar13->m_backend).data._M_elems + 4) =
                     local_138.data._M_elems._16_8_;
                *(ulong *)((pnVar13->m_backend).data._M_elems + 6) =
                     CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
                *(undefined8 *)(pnVar13->m_backend).data._M_elems = local_138.data._M_elems._0_8_;
                *(undefined8 *)((pnVar13->m_backend).data._M_elems + 2) =
                     local_138.data._M_elems._8_8_;
                (pnVar13->m_backend).exp = iVar7;
                (pnVar13->m_backend).neg = bVar12;
                (pnVar13->m_backend).fpclass = fVar8;
                (pnVar13->m_backend).prec_elem = iVar3;
                uVar4 = local_178.data._M_elems._16_8_;
              }
              else {
                local_b0 = pnVar13;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
                pnVar13 = local_b0;
                iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,&local_1f8);
                if (iVar6 != 0) goto LAB_0029193c;
                local_138.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_138.data._M_elems[1] = local_1b8.data._M_elems[1];
                uVar4 = local_138.data._M_elems._0_8_;
                local_138.data._M_elems[2] = local_1b8.data._M_elems[2];
                local_138.data._M_elems[3] = local_1b8.data._M_elems[3];
                local_138.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
                local_138.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
                local_138.data._M_elems[4] = local_1b8.data._M_elems[4];
                local_138.data._M_elems[5] = local_1b8.data._M_elems[5];
                local_138.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
                local_138.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
                local_138.exp = local_1b8.exp;
                fVar8 = local_1b8.fpclass;
                iVar3 = local_1b8.prec_elem;
                local_138.fpclass = local_1b8.fpclass;
                local_138.prec_elem = local_1b8.prec_elem;
                local_138.data._M_elems[0] = local_1b8.data._M_elems[0];
                local_138.neg = local_1b8.neg;
                if (local_138.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite) {
                  local_138.neg = (bool)(local_1b8.neg ^ 1);
                }
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems._24_5_ = 0;
                local_1f8.data._M_elems[7]._1_3_ = 0;
                local_1f8.data._M_elems._32_5_ = 0;
                local_1f8.data._M_elems[9]._1_3_ = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                pcVar18 = &local_138;
                if (&local_1f8 != pcVar23) {
                  local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
                  local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
                  local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
                  local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
                  local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
                  local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
                  local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
                  local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
                  local_1f8.exp = local_1b8.exp;
                  local_1f8.fpclass = fVar8;
                  local_1f8.prec_elem = iVar3;
                  pcVar18 = pcVar23;
                  local_1f8.data._M_elems._32_5_ = local_138.data._M_elems._32_5_;
                  local_1f8.data._M_elems[9]._1_3_ = local_138.data._M_elems[9]._1_3_;
                  local_1f8.neg = local_138.neg;
                }
                local_138.data._M_elems._0_8_ = uVar4;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_1f8,pcVar18);
                local_178.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_178.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                uVar4._0_4_ = local_1f8.data._M_elems[4];
                uVar4._4_4_ = local_1f8.data._M_elems[5];
                local_178.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_178.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_178.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_178.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_178.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_178.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_178.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_178.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_178.exp = local_1f8.exp;
                local_178.neg = local_1f8.neg;
                local_178.prec_elem = local_1f8.prec_elem;
                local_178.fpclass = local_1f8.fpclass;
                local_a8.data._M_elems._32_8_ =
                     *(undefined8 *)((local_100->m_backend).data._M_elems + 8);
                local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_100->m_backend).data._M_elems;
                local_a8.data._M_elems._8_8_ =
                     *(undefined8 *)((local_100->m_backend).data._M_elems + 2);
                local_a8.data._M_elems._16_8_ =
                     *(undefined8 *)((local_100->m_backend).data._M_elems + 4);
                local_a8.data._M_elems._24_8_ =
                     *(undefined8 *)((local_100->m_backend).data._M_elems + 6);
                local_a8.exp = (local_100->m_backend).exp;
                local_a8.neg = (local_100->m_backend).neg;
                local_a8.fpclass = (local_100->m_backend).fpclass;
                local_a8.prec_elem = (local_100->m_backend).prec_elem;
                if ((local_1f8.neg == true) &&
                   (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)) {
                  local_1f8.neg = false;
                }
                if ((local_a8.fpclass != cpp_dec_float_NaN && local_1f8.fpclass != cpp_dec_float_NaN
                    ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&local_1f8,&local_a8),
                         uVar4 = local_178.data._M_elems._16_8_, 0 < iVar6)) {
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 8) =
                       local_178.data._M_elems._32_8_;
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 4) =
                       local_178.data._M_elems._16_8_;
                  *(ulong *)((pnVar13->m_backend).data._M_elems + 6) =
                       CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
                  *(undefined8 *)(pnVar13->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 2) =
                       local_178.data._M_elems._8_8_;
                  (pnVar13->m_backend).exp = local_178.exp;
                  (pnVar13->m_backend).neg = local_178.neg;
                  (pnVar13->m_backend).fpclass = local_178.fpclass;
                  (pnVar13->m_backend).prec_elem = local_178.prec_elem;
                  iVar7 = local_c0[iVar7];
                  uVar14 = (uint)local_1c0;
                  uVar15 = uVar14;
                  if (0 < (int)uVar14) {
                    do {
                      uVar16 = (uint)local_1c0 - 1;
                      uVar21 = uVar16 >> 1;
                      uVar15 = (uint)local_1c0;
                      if (rhsidx[uVar21] <= iVar7) break;
                      rhsidx[local_1c0 & 0xffffffff] = rhsidx[uVar21];
                      local_1c0 = (ulong)uVar21;
                      uVar15 = uVar21;
                    } while (1 < uVar16);
                  }
                  local_1c0 = (ulong)(uVar14 + 1);
                  rhsidx[(int)uVar15] = iVar7;
                }
              }
              local_178.data._M_elems._16_8_ = uVar4;
              piVar22 = piVar22 + 1;
              pcVar23 = pcVar23 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        rhsn = (int)local_1c0;
      } while (0 < rhsn);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}